

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInit.c
# Opt level: O0

DdManager *
Cudd_Init(uint numVars,uint numVarsZ,uint numSlots,uint cacheSize,unsigned_long maxMemory)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _func_void_long *p_Var3;
  int iVar4;
  char *pcVar5;
  DdNode *pDVar6;
  ulong uVar7;
  DdNode **ppDVar8;
  DdNode *pDVar9;
  DD_OOMFP saveHandler;
  uint looseUpTo;
  uint maxCacheSize;
  DdNode *zero;
  DdNode *one;
  int result;
  int i;
  DdManager *unique;
  unsigned_long maxMemory_local;
  uint cacheSize_local;
  uint numSlots_local;
  uint numVarsZ_local;
  uint numVars_local;
  
  unique = (DdManager *)maxMemory;
  if (maxMemory == 0) {
    iVar4 = Extra_GetSoftDataLimit();
    unique = (DdManager *)(long)iVar4;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)unique / 0x28;
  _numVarsZ_local = cuddInitTable(numVars,numVarsZ,numSlots,SUB164(auVar1 / ZEXT816(5),0));
  if (_numVarsZ_local == (DdManager *)0x0) {
    _numVarsZ_local = (DdManager *)0x0;
  }
  else {
    _numVarsZ_local->maxmem = ((ulong)unique / 10) * 9;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (ulong)unique / 0x28;
    iVar4 = cuddInitCache(_numVarsZ_local,cacheSize,SUB164(auVar2 / ZEXT816(3),0));
    p_Var3 = Extra_UtilMMoutOfMemory;
    if (iVar4 == 0) {
      _numVarsZ_local = (DdManager *)0x0;
    }
    else {
      Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
      pcVar5 = (char *)malloc(((ulong)unique >> 6) + 4);
      _numVarsZ_local->stash = pcVar5;
      Extra_UtilMMoutOfMemory = p_Var3;
      if (_numVarsZ_local->stash == (char *)0x0) {
        fprintf((FILE *)_numVarsZ_local->err,"Unable to set aside memory\n");
      }
      pDVar6 = cuddUniqueConst(_numVarsZ_local,1.0);
      _numVarsZ_local->one = pDVar6;
      if (_numVarsZ_local->one == (DdNode *)0x0) {
        _numVarsZ_local = (DdManager *)0x0;
      }
      else {
        uVar7 = (ulong)_numVarsZ_local->one & 0xfffffffffffffffe;
        *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
        pDVar6 = cuddUniqueConst(_numVarsZ_local,0.0);
        _numVarsZ_local->zero = pDVar6;
        if (_numVarsZ_local->zero == (DdNode *)0x0) {
          _numVarsZ_local = (DdManager *)0x0;
        }
        else {
          uVar7 = (ulong)_numVarsZ_local->zero & 0xfffffffffffffffe;
          *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
          pDVar6 = cuddUniqueConst(_numVarsZ_local,1e+302);
          _numVarsZ_local->plusinfinity = pDVar6;
          if (_numVarsZ_local->plusinfinity == (DdNode *)0x0) {
            _numVarsZ_local = (DdManager *)0x0;
          }
          else {
            uVar7 = (ulong)_numVarsZ_local->plusinfinity & 0xfffffffffffffffe;
            *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
            pDVar6 = cuddUniqueConst(_numVarsZ_local,-1e+302);
            _numVarsZ_local->minusinfinity = pDVar6;
            if (_numVarsZ_local->minusinfinity == (DdNode *)0x0) {
              _numVarsZ_local = (DdManager *)0x0;
            }
            else {
              uVar7 = (ulong)_numVarsZ_local->minusinfinity & 0xfffffffffffffffe;
              *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
              _numVarsZ_local->background = _numVarsZ_local->zero;
              pDVar6 = _numVarsZ_local->one;
              ppDVar8 = (DdNode **)malloc((long)_numVarsZ_local->maxSize << 3);
              _numVarsZ_local->vars = ppDVar8;
              if (_numVarsZ_local->vars == (DdNode **)0x0) {
                _numVarsZ_local->errorCode = CUDD_MEMORY_OUT;
                _numVarsZ_local = (DdManager *)0x0;
              }
              else {
                for (one._4_4_ = 0; one._4_4_ < _numVarsZ_local->size; one._4_4_ = one._4_4_ + 1) {
                  pDVar9 = cuddUniqueInter(_numVarsZ_local,one._4_4_,pDVar6,
                                           (DdNode *)((ulong)pDVar6 ^ 1));
                  _numVarsZ_local->vars[one._4_4_] = pDVar9;
                  if (_numVarsZ_local->vars[one._4_4_] == (DdNode *)0x0) {
                    return (DdManager *)0x0;
                  }
                  uVar7 = (ulong)_numVarsZ_local->vars[one._4_4_] & 0xfffffffffffffffe;
                  *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
                }
                if (_numVarsZ_local->sizeZ != 0) {
                  cuddZddInitUniv(_numVarsZ_local);
                }
                _numVarsZ_local->memused =
                     (long)_numVarsZ_local->maxSize * 8 + _numVarsZ_local->memused;
                _numVarsZ_local->bFunc = (DdNode *)0x0;
                _numVarsZ_local->bFunc2 = (DdNode *)0x0;
                _numVarsZ_local->TimeStop = 0;
              }
            }
          }
        }
      }
    }
  }
  return _numVarsZ_local;
}

Assistant:

DdManager *
Cudd_Init(
  unsigned int numVars /* initial number of BDD variables (i.e., subtables) */,
  unsigned int numVarsZ /* initial number of ZDD variables (i.e., subtables) */,
  unsigned int numSlots /* initial size of the unique tables */,
  unsigned int cacheSize /* initial size of the cache */,
  unsigned long maxMemory /* target maximum memory occupation */)
{
    DdManager *unique;
    int i,result;
    DdNode *one, *zero;
    unsigned int maxCacheSize;
    unsigned int looseUpTo;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (maxMemory == 0) {
        maxMemory = getSoftDataLimit();
    }
    looseUpTo = (unsigned int) ((maxMemory / sizeof(DdNode)) /
                                DD_MAX_LOOSE_FRACTION);
    unique = cuddInitTable(numVars,numVarsZ,numSlots,looseUpTo);
    if (unique == NULL) return(NULL);
    unique->maxmem = (unsigned long) maxMemory / 10 * 9;
    maxCacheSize = (unsigned int) ((maxMemory / sizeof(DdCache)) /
                                   DD_MAX_CACHE_FRACTION);
    result = cuddInitCache(unique,cacheSize,maxCacheSize);
    if (result == 0) return(NULL);

    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
    unique->stash = ABC_ALLOC(char,(maxMemory / DD_STASH_FRACTION) + 4);
    MMoutOfMemory = saveHandler;
    if (unique->stash == NULL) {
        (void) fprintf(unique->err,"Unable to set aside memory\n");
    }

    /* Initialize constants. */
    unique->one = cuddUniqueConst(unique,1.0);
    if (unique->one == NULL) return(0);
    cuddRef(unique->one);
    unique->zero = cuddUniqueConst(unique,0.0);
    if (unique->zero == NULL) return(0);
    cuddRef(unique->zero);
#ifdef HAVE_IEEE_754
    if (DD_PLUS_INF_VAL != DD_PLUS_INF_VAL * 3 ||
        DD_PLUS_INF_VAL != DD_PLUS_INF_VAL / 3) {
        (void) fprintf(unique->err,"Warning: Crippled infinite values\n");
        (void) fprintf(unique->err,"Recompile without -DHAVE_IEEE_754\n");
    }
#endif
    unique->plusinfinity = cuddUniqueConst(unique,DD_PLUS_INF_VAL);
    if (unique->plusinfinity == NULL) return(0);
    cuddRef(unique->plusinfinity);
    unique->minusinfinity = cuddUniqueConst(unique,DD_MINUS_INF_VAL);
    if (unique->minusinfinity == NULL) return(0);
    cuddRef(unique->minusinfinity);
    unique->background = unique->zero;

    /* The logical zero is different from the CUDD_VALUE_TYPE zero! */
    one = unique->one;
    zero = Cudd_Not(one);
    /* Create the projection functions. */
    unique->vars = ABC_ALLOC(DdNodePtr,unique->maxSize);
    if (unique->vars == NULL) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < unique->size; i++) {
        unique->vars[i] = cuddUniqueInter(unique,i,one,zero);
        if (unique->vars[i] == NULL) return(0);
        cuddRef(unique->vars[i]);
    }

    if (unique->sizeZ)
        cuddZddInitUniv(unique);

    unique->memused += sizeof(DdNode *) * unique->maxSize;

    unique->bFunc = NULL;
    unique->bFunc2 = NULL;
    unique->TimeStop = 0;
    return(unique);

}